

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O0

int sparse_file_callback
              (sparse_file *s,bool sparse,bool crc,_func_int_void_ptr_void_ptr_size_t *write,
              void *priv)

{
  byte bVar1;
  uint uVar2;
  output_file *poVar3;
  output_file *in_RCX;
  byte in_DL;
  byte bVar4;
  byte in_SIL;
  undefined8 in_R8;
  uint block_size;
  int unaff_retaddr;
  int in_stack_00000008;
  output_file *out;
  int chunks;
  int ret;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined6 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  block_size = (uint)((ulong)in_R8 >> 0x20);
  bVar4 = in_SIL & 1;
  bVar1 = in_DL & 1;
  uVar2 = sparse_count_chunks((sparse_file *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  poVar3 = output_file_open_callback
                     ((_func_int_void_ptr_void_ptr_size_t *)
                      CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),in_RCX,block_size,
                      CONCAT44(in_stack_ffffffffffffffd4,uVar2),
                      (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                      ,unaff_retaddr,in_stack_00000008);
  if (poVar3 == (output_file *)0x0) {
    local_4 = -0xc;
  }
  else {
    local_4 = write_all_blocks((sparse_file *)
                               CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),in_RCX);
    output_file_close((output_file *)0x106e89);
  }
  return local_4;
}

Assistant:

int sparse_file_callback(struct sparse_file* s, bool sparse, bool crc,
                         int (*write)(void* priv, const void* data, size_t len), void* priv) {
  int ret;
  int chunks;
  struct output_file* out;

  chunks = sparse_count_chunks(s);
  out = output_file_open_callback(write, priv, s->block_size, s->len, false, sparse, chunks, crc);

  if (!out) return -ENOMEM;

  ret = write_all_blocks(s, out);

  output_file_close(out);

  return ret;
}